

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

string * ot::commissioner::utils::ToLower(string *__return_storage_ptr__,string *aStr)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  string *__range2;
  size_type sVar4;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)aStr);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    iVar3 = tolower((int)pcVar1[sVar4]);
    pcVar1[sVar4] = (char)iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToLower(const std::string &aStr)
{
    std::string ret = aStr;
    for (auto &c : ret)
    {
        c = tolower(c);
    }
    return ret;
}